

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::PrepareCommittedResources
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CommittedShaderResources *Resources
          ,Uint32 *DvpCompatibleSRBCount)

{
  byte bVar1;
  PipelineStateVkImpl *this_00;
  RefCountersImpl *in_RAX;
  PipelineResourceSignatureImplType *pPVar2;
  PipelineResourceSignatureVkImpl *pPVar3;
  Uint32 UVar4;
  uint Index;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> pSRB;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> local_38;
  
  this_00 = (this->m_pPipelineState).m_pObject;
  local_38.m_pObject = (ShaderResourceBindingVkImpl *)in_RAX;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  bVar1 = (this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
  Resources->ActiveSRBMask = '\0';
  if (bVar1 != 0) {
    UVar4 = 0;
    do {
      pPVar2 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                         (&((this->m_pPipelineState).m_pObject)->
                           super_PipelineStateBase<Diligent::EngineVkImplTraits>,UVar4);
      if ((pPVar2 != (PipelineResourceSignatureImplType *)0x0) &&
         ((pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
          .m_Desc.NumResources != 0)) {
        Resources->ActiveSRBMask = Resources->ActiveSRBMask | (byte)(1 << ((byte)UVar4 & 0x1f));
      }
      UVar4 = UVar4 + 1;
    } while (bVar1 != UVar4);
  }
  *DvpCompatibleSRBCount = 0;
  uVar5 = (uint)bVar1;
  if (bVar1 != 0) {
    do {
      RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Lock
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)&local_38);
      pPVar2 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                         (&((this->m_pPipelineState).m_pObject)->
                           super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                          *DvpCompatibleSRBCount);
      if ((RefCountersImpl *)local_38.m_pObject == (RefCountersImpl *)0x0) {
        pPVar3 = (PipelineResourceSignatureVkImpl *)0x0;
      }
      else {
        pPVar3 = ((local_38.m_pObject)->
                 super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).m_pPRS.m_pObject;
      }
      bVar7 = true;
      bVar6 = true;
      if (pPVar2 != (PipelineResourceSignatureImplType *)0x0) {
        bVar6 = (pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc.NumResources == 0;
      }
      if (pPVar3 != (PipelineResourceSignatureVkImpl *)0x0) {
        bVar7 = (pPVar3->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc.NumResources == 0;
      }
      if ((bVar6 != bVar7) ||
         (((pPVar2 != (PipelineResourceSignatureImplType *)0x0 &&
           (pPVar3 != (PipelineResourceSignatureVkImpl *)0x0)) &&
          ((pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_Hash !=
           (pPVar3->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_Hash)))) {
        RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::Release(&local_38);
        break;
      }
      RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::Release(&local_38);
      UVar4 = *DvpCompatibleSRBCount;
      *DvpCompatibleSRBCount = UVar4 + 1;
    } while (UVar4 + 1 < uVar5);
  }
  Index = *DvpCompatibleSRBCount;
  if (Index < uVar5) {
    do {
      CommittedShaderResources::Set(Resources,Index,(ShaderResourceBindingImplType *)0x0);
      Index = Index + 1;
    } while (uVar5 != Index);
  }
  Resources->ResourcesValidated = false;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::PrepareCommittedResources(CommittedShaderResources& Resources, Uint32& DvpCompatibleSRBCount)
{
    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();

    Resources.ActiveSRBMask = 0;
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        const PipelineResourceSignatureImplType* pSignature = m_pPipelineState->GetResourceSignature(i);
        if (pSignature == nullptr || pSignature->GetTotalResourceCount() == 0)
            continue;

        Resources.ActiveSRBMask |= 1u << i;
    }

    DvpCompatibleSRBCount = 0;

#ifdef DILIGENT_DEVELOPMENT
    // Layout compatibility means that descriptor sets can be bound to a command buffer
    // for use by any pipeline created with a compatible pipeline layout, and without having bound
    // a particular pipeline first. It also means that descriptor sets can remain valid across
    // a pipeline change, and the same resources will be accessible to the newly bound pipeline.
    // (14.2.2. Pipeline Layouts, clause 'Pipeline Layout Compatibility')
    // https://www.khronos.org/registry/vulkan/specs/1.2-extensions/html/vkspec.html#descriptorsets-compatibility

    // Find the number of SRBs compatible with signatures in the current pipeline
    for (; DvpCompatibleSRBCount < SignCount; ++DvpCompatibleSRBCount)
    {
        RefCntAutoPtr<ShaderResourceBindingImplType> pSRB = Resources.SRBs[DvpCompatibleSRBCount].Lock();

        const PipelineResourceSignatureImplType* pPSOSign = m_pPipelineState->GetResourceSignature(DvpCompatibleSRBCount);
        const PipelineResourceSignatureImplType* pSRBSign = pSRB ? pSRB->GetSignature() : nullptr;

        if ((pPSOSign == nullptr || pPSOSign->GetTotalResourceCount() == 0) !=
            (pSRBSign == nullptr || pSRBSign->GetTotalResourceCount() == 0))
        {
            // One signature is null or empty while the other is not - SRB is not compatible with the PSO.
            break;
        }

        if (pPSOSign != nullptr && pSRBSign != nullptr && pPSOSign->IsIncompatibleWith(*pSRBSign))
        {
            // Signatures are incompatible
            break;
        }
    }

    // Unbind incompatible shader resources
    // A consequence of layout compatibility is that when the implementation compiles a pipeline
    // layout and maps pipeline resources to implementation resources, the mechanism for set N
    // should only be a function of sets [0..N].
    for (Uint32 sign = DvpCompatibleSRBCount; sign < SignCount; ++sign)
    {
        Resources.Set(sign, nullptr);
    }

    Resources.ResourcesValidated = false;
#endif
}